

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesXPath.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::XPathScanner::scanExpression
          (XPathScanner *this,XMLCh *data,XMLSize_t currentOffset,XMLSize_t endOffset,
          ValueVectorOf<int> *tokens)

{
  XMLStringPool *pXVar1;
  XMLCh XVar2;
  bool bVar3;
  MemoryManager *pMVar4;
  XMLCh *pXVar5;
  ValueVectorOf<int> *pVVar6;
  XPathException *pXVar7;
  undefined1 local_d2;
  XMLCh local_c2 [2];
  byte local_be;
  byte local_bd;
  undefined1 auStack_bc [2];
  XMLCh str_1 [2];
  bool isAxisName;
  bool isNameTestNCName;
  XMLSize_t litOffset;
  XMLCh qchar;
  undefined2 local_a0;
  undefined1 local_9d;
  XMLCh str [2];
  XMLByte chartype;
  undefined1 local_90 [8];
  XMLBuffer dataBuffer;
  int local_50;
  int iStack_4c;
  XMLCh ch;
  int prefixHandle;
  int nameHandle;
  XMLSize_t nameOffset;
  ValueVectorOf<int> *pVStack_38;
  bool starIsMultiplyOperator;
  ValueVectorOf<int> *tokens_local;
  XMLSize_t endOffset_local;
  XMLSize_t currentOffset_local;
  XMLCh *data_local;
  XPathScanner *this_local;
  
  nameOffset._7_1_ = 0;
  _prefixHandle = (ValueVectorOf<int> *)0x0;
  iStack_4c = -1;
  local_50 = -1;
  pVStack_38 = tokens;
  tokens_local = (ValueVectorOf<int> *)endOffset;
  endOffset_local = currentOffset;
  currentOffset_local = (XMLSize_t)data;
  data_local = (XMLCh *)this;
  pMVar4 = ValueVectorOf<int>::getMemoryManager(tokens);
  XMLBuffer::XMLBuffer((XMLBuffer *)local_90,0x80,pMVar4);
  do {
    if ((ValueVectorOf<int> *)endOffset_local == tokens_local) {
LAB_0040ec0a:
      this_local._7_1_ = 1;
      goto LAB_0040ec18;
    }
    dataBuffer.fBuffer._6_2_ = *(XMLCh *)(currentOffset_local + endOffset_local * 2);
    while ((bVar3 = XMLChar1_0::isWhitespace(dataBuffer.fBuffer._6_2_),
           XVar2 = dataBuffer.fBuffer._6_2_, bVar3 &&
           (endOffset_local = endOffset_local + 1,
           (ValueVectorOf<int> *)endOffset_local != tokens_local))) {
      dataBuffer.fBuffer._6_2_ = *(XMLCh *)(currentOffset_local + endOffset_local * 2);
    }
    if ((ValueVectorOf<int> *)endOffset_local == tokens_local) goto LAB_0040ec0a;
    if ((ushort)dataBuffer.fBuffer._6_2_ < 0x80) {
      local_d2 = fASCIICharMap[(ushort)dataBuffer.fBuffer._6_2_];
    }
    else {
      local_d2 = 0x19;
    }
    local_9d = local_d2;
    switch(local_d2) {
    case 3:
      endOffset_local = endOffset_local + 1;
      if ((ValueVectorOf<int> *)endOffset_local == tokens_local) {
        this_local._7_1_ = 0;
        goto LAB_0040ec18;
      }
      dataBuffer.fBuffer._6_2_ = *(XMLCh *)(currentOffset_local + endOffset_local * 2);
      if (dataBuffer.fBuffer._6_2_ != L'=') {
        this_local._7_1_ = 0;
        goto LAB_0040ec18;
      }
      (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x1b);
      nameOffset._7_1_ = 0;
      endOffset_local = endOffset_local + 1;
      break;
    case 4:
      pVVar6 = (ValueVectorOf<int> *)(endOffset_local + 1);
      endOffset_local = (XMLSize_t)pVVar6;
      if (pVVar6 == tokens_local) {
        this_local._7_1_ = 0;
        goto LAB_0040ec18;
      }
      dataBuffer.fBuffer._6_2_ = *(XMLCh *)(currentOffset_local + (long)pVVar6 * 2);
      while (unique0x10001077 = pVVar6, dataBuffer.fBuffer._6_2_ != XVar2) {
        endOffset_local = endOffset_local + 1;
        if ((ValueVectorOf<int> *)endOffset_local == tokens_local) {
          this_local._7_1_ = 0;
          goto LAB_0040ec18;
        }
        dataBuffer.fBuffer._6_2_ = *(XMLCh *)(currentOffset_local + endOffset_local * 2);
      }
      (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x2e);
      nameOffset._7_1_ = 1;
      XMLBuffer::set((XMLBuffer *)local_90,
                     (XMLCh *)(currentOffset_local + (long)stack0xffffffffffffff48 * 2),
                     endOffset_local - (long)stack0xffffffffffffff48);
      pVVar6 = pVStack_38;
      pXVar1 = this->fStringPool;
      pXVar5 = XMLBuffer::getRawBuffer((XMLBuffer *)local_90);
      _auStack_bc = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])(pXVar1,pXVar5);
      ValueVectorOf<int>::addElement(pVVar6,(int *)auStack_bc);
      endOffset_local = endOffset_local + 1;
      break;
    case 5:
      endOffset_local = endOffset_local + 1;
      if ((ValueVectorOf<int> *)endOffset_local == tokens_local) {
        this_local._7_1_ = 0;
        goto LAB_0040ec18;
      }
      _prefixHandle = (ValueVectorOf<int> *)endOffset_local;
      endOffset_local =
           scanNCName(this,(XMLCh *)currentOffset_local,(XMLSize_t)tokens_local,endOffset_local);
      if ((ValueVectorOf<int> *)endOffset_local == _prefixHandle) {
        this_local._7_1_ = 0;
        goto LAB_0040ec18;
      }
      if (endOffset_local < tokens_local) {
        dataBuffer.fBuffer._6_2_ = *(XMLCh *)(currentOffset_local + endOffset_local * 2);
      }
      else {
        dataBuffer.fBuffer._6_2_ = L'\0';
      }
      XMLBuffer::set((XMLBuffer *)local_90,(XMLCh *)(currentOffset_local + (long)_prefixHandle * 2),
                     endOffset_local - (long)_prefixHandle);
      pXVar1 = this->fStringPool;
      pXVar5 = XMLBuffer::getRawBuffer((XMLBuffer *)local_90);
      iStack_4c = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])(pXVar1,pXVar5);
      local_50 = -1;
      if (dataBuffer.fBuffer._6_2_ == L':') {
        endOffset_local = endOffset_local + 1;
        local_50 = iStack_4c;
        if ((ValueVectorOf<int> *)endOffset_local == tokens_local) {
          this_local._7_1_ = 0;
          goto LAB_0040ec18;
        }
        _prefixHandle = (ValueVectorOf<int> *)endOffset_local;
        endOffset_local =
             scanNCName(this,(XMLCh *)currentOffset_local,(XMLSize_t)tokens_local,endOffset_local);
        if ((ValueVectorOf<int> *)endOffset_local == _prefixHandle) {
          this_local._7_1_ = 0;
          goto LAB_0040ec18;
        }
        XMLBuffer::set((XMLBuffer *)local_90,
                       (XMLCh *)(currentOffset_local + (long)_prefixHandle * 2),
                       endOffset_local - (long)_prefixHandle);
        pXVar1 = this->fStringPool;
        pXVar5 = XMLBuffer::getRawBuffer((XMLBuffer *)local_90);
        iStack_4c = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])(pXVar1,pXVar5);
      }
      (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x30);
      nameOffset._7_1_ = 1;
      ValueVectorOf<int>::addElement(pVStack_38,&local_50);
      ValueVectorOf<int>::addElement(pVStack_38,&stack0xffffffffffffffb4);
      break;
    case 6:
      (*this->_vptr_XPathScanner[2])(this,pVStack_38,0);
      nameOffset._7_1_ = 0;
      endOffset_local = endOffset_local + 1;
      break;
    case 7:
      (*this->_vptr_XPathScanner[2])(this,pVStack_38,1);
      nameOffset._7_1_ = 1;
      endOffset_local = endOffset_local + 1;
      break;
    case 8:
      bVar3 = (nameOffset._7_1_ & 1) == 0;
      if (bVar3) {
        (*this->_vptr_XPathScanner[2])(this,pVStack_38,9);
      }
      else {
        (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x14);
      }
      endOffset_local = endOffset_local + 1;
      nameOffset._7_1_ = bVar3;
      break;
    case 9:
      (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x18);
      nameOffset._7_1_ = 0;
      endOffset_local = endOffset_local + 1;
      break;
    case 10:
      (*this->_vptr_XPathScanner[2])(this,pVStack_38,7);
      nameOffset._7_1_ = 0;
      endOffset_local = endOffset_local + 1;
      break;
    case 0xb:
      (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x19);
      nameOffset._7_1_ = 0;
      endOffset_local = endOffset_local + 1;
      break;
    case 0xc:
      if ((ValueVectorOf<int> *)(endOffset_local + 1) == tokens_local) {
        (*this->_vptr_XPathScanner[2])(this,pVStack_38,4);
        nameOffset._7_1_ = 1;
        endOffset_local = endOffset_local + 1;
      }
      else {
        dataBuffer.fBuffer._6_2_ = *(XMLCh *)(currentOffset_local + 2 + endOffset_local * 2);
        if (dataBuffer.fBuffer._6_2_ == L'.') {
          (*this->_vptr_XPathScanner[2])(this,pVStack_38,5);
          nameOffset._7_1_ = 1;
          endOffset_local = endOffset_local + 2;
        }
        else if (((ushort)dataBuffer.fBuffer._6_2_ < 0x30) ||
                (0x39 < (ushort)dataBuffer.fBuffer._6_2_)) {
          if (dataBuffer.fBuffer._6_2_ == L'/') {
            (*this->_vptr_XPathScanner[2])(this,pVStack_38,4);
            nameOffset._7_1_ = 1;
            endOffset_local = endOffset_local + 1;
          }
          else if (dataBuffer.fBuffer._6_2_ == L'|') {
            (*this->_vptr_XPathScanner[2])(this,pVStack_38,4);
            nameOffset._7_1_ = 1;
            endOffset_local = endOffset_local + 1;
          }
          else {
            bVar3 = XMLChar1_0::isWhitespace(dataBuffer.fBuffer._6_2_);
            if (!bVar3) {
              qchar = dataBuffer.fBuffer._6_2_;
              local_a0 = 0;
              pXVar7 = (XPathException *)__cxa_allocate_exception(0x30);
              pMVar4 = ValueVectorOf<int>::getMemoryManager(pVStack_38);
              XPathException::XPathException
                        (pXVar7,
                         "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                         ,0x37c,XPath_InvalidChar,&qchar,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                         pMVar4);
              __cxa_throw(pXVar7,&XPathException::typeinfo,XPathException::~XPathException);
            }
            do {
              endOffset_local = endOffset_local + 1;
              if ((ValueVectorOf<int> *)endOffset_local == tokens_local) break;
              dataBuffer.fBuffer._6_2_ = *(XMLCh *)(currentOffset_local + endOffset_local * 2);
              bVar3 = XMLChar1_0::isWhitespace(dataBuffer.fBuffer._6_2_);
            } while (bVar3);
            if ((((ValueVectorOf<int> *)endOffset_local == tokens_local) ||
                (dataBuffer.fBuffer._6_2_ == L'|')) || (dataBuffer.fBuffer._6_2_ == L'/')) {
              (*this->_vptr_XPathScanner[2])(this,pVStack_38,4);
              nameOffset._7_1_ = 1;
            }
          }
        }
        else {
          (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x2f);
          nameOffset._7_1_ = 1;
          endOffset_local =
               scanNumber(this,(XMLCh *)currentOffset_local,(XMLSize_t)tokens_local,endOffset_local,
                          pVStack_38);
        }
      }
      break;
    case 0xd:
      endOffset_local = endOffset_local + 1;
      if ((ValueVectorOf<int> *)endOffset_local == tokens_local) {
        (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x15);
        nameOffset._7_1_ = 0;
      }
      else {
        dataBuffer.fBuffer._6_2_ = *(XMLCh *)(currentOffset_local + endOffset_local * 2);
        if (dataBuffer.fBuffer._6_2_ == L'/') {
          (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x16);
          endOffset_local = endOffset_local + 1;
        }
        else {
          (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x15);
        }
        nameOffset._7_1_ = 0;
      }
      break;
    case 0xe:
      (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x2f);
      nameOffset._7_1_ = 1;
      endOffset_local =
           scanNumber(this,(XMLCh *)currentOffset_local,(XMLSize_t)tokens_local,endOffset_local,
                      pVStack_38);
      break;
    case 0xf:
      endOffset_local = endOffset_local + 1;
      if ((ValueVectorOf<int> *)endOffset_local == tokens_local) {
        this_local._7_1_ = 0;
        goto LAB_0040ec18;
      }
      dataBuffer.fBuffer._6_2_ = *(XMLCh *)(currentOffset_local + endOffset_local * 2);
      if (dataBuffer.fBuffer._6_2_ != L':') {
        this_local._7_1_ = 0;
        goto LAB_0040ec18;
      }
      (*this->_vptr_XPathScanner[2])(this,pVStack_38,8);
      nameOffset._7_1_ = 0;
      endOffset_local = endOffset_local + 1;
      break;
    case 0x10:
      endOffset_local = endOffset_local + 1;
      if ((ValueVectorOf<int> *)endOffset_local == tokens_local) {
        (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x1c);
        nameOffset._7_1_ = 0;
      }
      else {
        dataBuffer.fBuffer._6_2_ = *(XMLCh *)(currentOffset_local + endOffset_local * 2);
        if (dataBuffer.fBuffer._6_2_ == L'=') {
          (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x1d);
          endOffset_local = endOffset_local + 1;
        }
        else {
          (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x1c);
        }
        nameOffset._7_1_ = 0;
      }
      break;
    case 0x11:
      (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x1a);
      nameOffset._7_1_ = 0;
      endOffset_local = endOffset_local + 1;
      break;
    case 0x12:
      endOffset_local = endOffset_local + 1;
      if ((ValueVectorOf<int> *)endOffset_local == tokens_local) {
        (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x1e);
        nameOffset._7_1_ = 0;
      }
      else {
        dataBuffer.fBuffer._6_2_ = *(XMLCh *)(currentOffset_local + endOffset_local * 2);
        if (dataBuffer.fBuffer._6_2_ == L'=') {
          (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x1f);
          endOffset_local = endOffset_local + 1;
        }
        else {
          (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x1e);
        }
        nameOffset._7_1_ = 0;
      }
      break;
    case 0x13:
      (*this->_vptr_XPathScanner[2])(this,pVStack_38,6);
      nameOffset._7_1_ = 0;
      endOffset_local = endOffset_local + 1;
      break;
    case 0x14:
    case 0x17:
    case 0x19:
      _prefixHandle = (ValueVectorOf<int> *)endOffset_local;
      endOffset_local =
           scanNCName(this,(XMLCh *)currentOffset_local,(XMLSize_t)tokens_local,endOffset_local);
      if ((ValueVectorOf<int> *)endOffset_local == _prefixHandle) {
        this_local._7_1_ = 0;
        goto LAB_0040ec18;
      }
      if (endOffset_local < tokens_local) {
        dataBuffer.fBuffer._6_2_ = *(XMLCh *)(currentOffset_local + endOffset_local * 2);
      }
      else {
        dataBuffer.fBuffer._6_2_ = L'\0';
      }
      XMLBuffer::set((XMLBuffer *)local_90,(XMLCh *)(currentOffset_local + (long)_prefixHandle * 2),
                     endOffset_local - (long)_prefixHandle);
      pXVar1 = this->fStringPool;
      pXVar5 = XMLBuffer::getRawBuffer((XMLBuffer *)local_90);
      iStack_4c = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])(pXVar1,pXVar5);
      local_bd = 0;
      local_be = 0;
      local_50 = -1;
      if (dataBuffer.fBuffer._6_2_ == L':') {
        pVVar6 = (ValueVectorOf<int> *)(endOffset_local + 1);
        if (pVVar6 == tokens_local) {
          this_local._7_1_ = 0;
          endOffset_local = (XMLSize_t)pVVar6;
          goto LAB_0040ec18;
        }
        dataBuffer.fBuffer._6_2_ = *(XMLCh *)(currentOffset_local + (long)pVVar6 * 2);
        if (dataBuffer.fBuffer._6_2_ == L'*') {
          endOffset_local = endOffset_local + 2;
          if (endOffset_local < tokens_local) {
            dataBuffer.fBuffer._6_2_ = *(XMLCh *)(currentOffset_local + endOffset_local * 2);
          }
          local_bd = 1;
        }
        else if (dataBuffer.fBuffer._6_2_ == L':') {
          endOffset_local = endOffset_local + 2;
          if (endOffset_local < tokens_local) {
            dataBuffer.fBuffer._6_2_ = *(XMLCh *)(currentOffset_local + endOffset_local * 2);
          }
          local_be = 1;
        }
        else {
          local_50 = iStack_4c;
          _prefixHandle = pVVar6;
          endOffset_local = (XMLSize_t)pVVar6;
          endOffset_local =
               scanNCName(this,(XMLCh *)currentOffset_local,(XMLSize_t)tokens_local,
                          (XMLSize_t)pVVar6);
          if ((ValueVectorOf<int> *)endOffset_local == _prefixHandle) {
            this_local._7_1_ = 0;
            goto LAB_0040ec18;
          }
          if (endOffset_local < tokens_local) {
            dataBuffer.fBuffer._6_2_ = *(XMLCh *)(currentOffset_local + endOffset_local * 2);
          }
          else {
            dataBuffer.fBuffer._6_2_ = L'\0';
          }
          XMLBuffer::set((XMLBuffer *)local_90,
                         (XMLCh *)(currentOffset_local + (long)_prefixHandle * 2),
                         endOffset_local - (long)_prefixHandle);
          pXVar1 = this->fStringPool;
          pXVar5 = XMLBuffer::getRawBuffer((XMLBuffer *)local_90);
          iStack_4c = (*(pXVar1->super_XSerializable)._vptr_XSerializable[5])(pXVar1,pXVar5);
        }
      }
      while ((bVar3 = XMLChar1_0::isWhitespace(dataBuffer.fBuffer._6_2_), bVar3 &&
             (endOffset_local = endOffset_local + 1,
             (ValueVectorOf<int> *)endOffset_local != tokens_local))) {
        dataBuffer.fBuffer._6_2_ = *(XMLCh *)(currentOffset_local + endOffset_local * 2);
      }
      if ((nameOffset._7_1_ & 1) == 0) {
        if (((dataBuffer.fBuffer._6_2_ == L'(') && ((local_bd & 1) == 0)) && ((local_be & 1) == 0))
        {
          if (iStack_4c == this->fCommentSymbol) {
            (*this->_vptr_XPathScanner[2])(this,pVStack_38,0xc);
          }
          else if (iStack_4c == this->fTextSymbol) {
            (*this->_vptr_XPathScanner[2])(this,pVStack_38,0xd);
          }
          else if (iStack_4c == this->fPISymbol) {
            (*this->_vptr_XPathScanner[2])(this,pVStack_38,0xe);
          }
          else if (iStack_4c == this->fNodeSymbol) {
            (*this->_vptr_XPathScanner[2])(this,pVStack_38,0xf);
          }
          else {
            (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x20);
            ValueVectorOf<int>::addElement(pVStack_38,&local_50);
            ValueVectorOf<int>::addElement(pVStack_38,&stack0xffffffffffffffb4);
          }
          (*this->_vptr_XPathScanner[2])(this,pVStack_38,0);
          nameOffset._7_1_ = 0;
          endOffset_local = endOffset_local + 1;
        }
        else if (((local_be & 1) == 0) &&
                (((dataBuffer.fBuffer._6_2_ != L':' ||
                  (tokens_local <= (ValueVectorOf<int> *)(endOffset_local + 1))) ||
                 (*(short *)(currentOffset_local + 2 + endOffset_local * 2) != 0x3a)))) {
          if ((local_bd & 1) == 0) {
            (*this->_vptr_XPathScanner[2])(this,pVStack_38,0xb);
            ValueVectorOf<int>::addElement(pVStack_38,&local_50);
            ValueVectorOf<int>::addElement(pVStack_38,&stack0xffffffffffffffb4);
          }
          else {
            (*this->_vptr_XPathScanner[2])(this,pVStack_38,10);
            ValueVectorOf<int>::addElement(pVStack_38,&stack0xffffffffffffffb4);
          }
          nameOffset._7_1_ = 1;
        }
        else {
          if (iStack_4c == this->fAncestorSymbol) {
            (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x21);
          }
          else if (iStack_4c == this->fAncestorOrSelfSymbol) {
            (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x22);
          }
          else if (iStack_4c == this->fAttributeSymbol) {
            (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x23);
          }
          else if (iStack_4c == this->fChildSymbol) {
            (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x24);
          }
          else if (iStack_4c == this->fDescendantSymbol) {
            (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x25);
          }
          else if (iStack_4c == this->fDescendantOrSelfSymbol) {
            (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x26);
          }
          else if (iStack_4c == this->fFollowingSymbol) {
            (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x27);
          }
          else if (iStack_4c == this->fFollowingSiblingSymbol) {
            (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x28);
          }
          else if (iStack_4c == this->fNamespaceSymbol) {
            (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x29);
          }
          else if (iStack_4c == this->fParentSymbol) {
            (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x2a);
          }
          else if (iStack_4c == this->fPrecedingSymbol) {
            (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x2b);
          }
          else if (iStack_4c == this->fPrecedingSiblingSymbol) {
            (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x2c);
          }
          else {
            if (iStack_4c != this->fSelfSymbol) {
              this_local._7_1_ = 0;
              goto LAB_0040ec18;
            }
            (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x2d);
          }
          if ((local_bd & 1) != 0) {
            this_local._7_1_ = 0;
            goto LAB_0040ec18;
          }
          (*this->_vptr_XPathScanner[2])(this,pVStack_38,8);
          nameOffset._7_1_ = 0;
          if ((local_be & 1) == 0) {
            endOffset_local = endOffset_local + 2;
          }
        }
      }
      else {
        if (iStack_4c == this->fAndSymbol) {
          (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x10);
        }
        else if (iStack_4c == this->fOrSymbol) {
          (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x11);
        }
        else if (iStack_4c == this->fModSymbol) {
          (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x12);
        }
        else {
          if (iStack_4c != this->fDivSymbol) {
            this_local._7_1_ = 0;
            goto LAB_0040ec18;
          }
          (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x13);
        }
        nameOffset._7_1_ = 0;
        if ((local_bd & 1) != 0) {
          this_local._7_1_ = 0;
          goto LAB_0040ec18;
        }
        if ((local_be & 1) != 0) {
          this_local._7_1_ = 0;
LAB_0040ec18:
          XMLBuffer::~XMLBuffer((XMLBuffer *)local_90);
          return (bool)(this_local._7_1_ & 1);
        }
      }
      break;
    case 0x15:
      (*this->_vptr_XPathScanner[2])(this,pVStack_38,2);
      nameOffset._7_1_ = 0;
      endOffset_local = endOffset_local + 1;
      break;
    case 0x16:
      (*this->_vptr_XPathScanner[2])(this,pVStack_38,3);
      nameOffset._7_1_ = 1;
      endOffset_local = endOffset_local + 1;
      break;
    case 0x18:
      (*this->_vptr_XPathScanner[2])(this,pVStack_38,0x17);
      nameOffset._7_1_ = 0;
      endOffset_local = endOffset_local + 1;
      break;
    default:
      local_c2[0] = dataBuffer.fBuffer._6_2_;
      local_c2[1] = 0;
      pXVar7 = (XPathException *)__cxa_allocate_exception(0x30);
      pMVar4 = ValueVectorOf<int>::getMemoryManager(pVStack_38);
      XPathException::XPathException
                (pXVar7,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/schema/identity/XercesXPath.cpp"
                 ,0x539,XPath_InvalidChar,local_c2,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,pMVar4);
      __cxa_throw(pXVar7,&XPathException::typeinfo,XPathException::~XPathException);
    }
  } while( true );
}

Assistant:

bool XPathScanner::scanExpression(const XMLCh* const data,
                                  XMLSize_t currentOffset,
                                  const XMLSize_t endOffset,
                                  ValueVectorOf<int>* const tokens) {

    bool      starIsMultiplyOperator = false;
    XMLSize_t nameOffset = 0;
    int       nameHandle = -1;
    int       prefixHandle = -1;
    XMLCh     ch;
    XMLBuffer dataBuffer(128, tokens->getMemoryManager());

    while (currentOffset != endOffset) {

        ch = data[currentOffset];

        while (XMLChar1_0::isWhitespace(ch)) {

            if (++currentOffset == endOffset) {
                break;
            }

            ch = data[currentOffset];
        }

        if (currentOffset == endOffset) {
            break;
        }
        //
        // [28] ExprToken ::= '(' | ')' | '[' | ']' | '.' | '..' | '@' | ',' | '::'
        //                  | NameTest | NodeType | Operator | FunctionName
        //                  | AxisName | Literal | Number | VariableReference
        //
        XMLByte chartype = (ch >= 0x80) ? (XMLByte)CHARTYPE_NONASCII : fASCIICharMap[ch];

        switch (chartype) {
        case CHARTYPE_OPEN_PAREN:       // '('
            addToken(tokens, XercesXPath::EXPRTOKEN_OPEN_PAREN);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_CLOSE_PAREN:      // ')'
            addToken(tokens, XercesXPath::EXPRTOKEN_CLOSE_PAREN);
            starIsMultiplyOperator = true;
            ++currentOffset;
            break;
        case CHARTYPE_OPEN_BRACKET:     // '['
            addToken(tokens, XercesXPath::EXPRTOKEN_OPEN_BRACKET);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_CLOSE_BRACKET:    // ']'
            addToken(tokens, XercesXPath::EXPRTOKEN_CLOSE_BRACKET);
            starIsMultiplyOperator = true;
            ++currentOffset;
            break;
                //
                // [30] Number ::= Digits ('.' Digits?)? | '.' Digits
                //                                         ^^^^^^^^^^
                //
        case CHARTYPE_PERIOD:           // '.', '..' or '.' Digits
            if (currentOffset + 1 == endOffset) {
                addToken(tokens, XercesXPath::EXPRTOKEN_PERIOD);
                starIsMultiplyOperator = true;
                currentOffset++;
                break;
            }

            ch = data[currentOffset + 1];

            if (ch == chPeriod) {            // '..'
                addToken(tokens, XercesXPath::EXPRTOKEN_DOUBLE_PERIOD);
                starIsMultiplyOperator = true;
                currentOffset += 2;
            } else if (ch >= chDigit_0 && ch <= chDigit_9) {
                addToken(tokens, XercesXPath::EXPRTOKEN_NUMBER);
                starIsMultiplyOperator = true;
                currentOffset = scanNumber(data, endOffset, currentOffset, tokens);
            } else if (ch == chForwardSlash) {
                addToken(tokens, XercesXPath::EXPRTOKEN_PERIOD);
                starIsMultiplyOperator = true;
                currentOffset++;
            } else if (ch == chPipe) { // '|'
                addToken(tokens, XercesXPath::EXPRTOKEN_PERIOD);
                starIsMultiplyOperator = true;
                currentOffset++;
            } else if (XMLChar1_0::isWhitespace(ch)) {
                do {
                    if (++currentOffset == endOffset)
                        break;

                    ch = data[currentOffset];
                } while (XMLChar1_0::isWhitespace(ch));

                if (currentOffset == endOffset || ch == chPipe || ch == chForwardSlash) {
				    addToken(tokens, XercesXPath::EXPRTOKEN_PERIOD);
                    starIsMultiplyOperator = true;
                    break;
                }
            } else {
                XMLCh str[2]= {ch, 0 };
                ThrowXMLwithMemMgr1(XPathException, XMLExcepts::XPath_InvalidChar, str, tokens->getMemoryManager());
            }

            break;
        case CHARTYPE_ATSIGN:           // '@'
            addToken(tokens, XercesXPath::EXPRTOKEN_ATSIGN);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_COMMA:            // ','
            addToken(tokens, XercesXPath::EXPRTOKEN_COMMA);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_COLON:            // '::'
            if (++currentOffset == endOffset) {
                return false; // REVISIT
            }
            ch = data[currentOffset];

            if (ch != chColon) {
                return false; // REVISIT
            }
            addToken(tokens, XercesXPath::EXPRTOKEN_DOUBLE_COLON);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_SLASH:            // '/' and '//'
            if (++currentOffset == endOffset) {
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_SLASH);
                starIsMultiplyOperator = false;
                break;
            }

            ch = data[currentOffset];

            if (ch == chForwardSlash) { // '//'
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_DOUBLE_SLASH);
                starIsMultiplyOperator = false;
                ++currentOffset;
            } else {
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_SLASH);
                starIsMultiplyOperator = false;
            }
            break;
        case CHARTYPE_UNION:            // '|'
            addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_UNION);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_PLUS:             // '+'
            addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_PLUS);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_MINUS:            // '-'
            addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_MINUS);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_EQUAL:            // '='
            addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_EQUAL);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_EXCLAMATION:      // '!='
            if (++currentOffset == endOffset) {
                return false; // REVISIT
            }

            ch = data[currentOffset];

            if (ch != chEqual) {
                return false; // REVISIT
            }

            addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_NOT_EQUAL);
            starIsMultiplyOperator = false;
            ++currentOffset;
            break;
        case CHARTYPE_LESS: // '<' and '<='
            if (++currentOffset == endOffset) {
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_LESS);
                starIsMultiplyOperator = false;
                break;
            }

            ch = data[currentOffset];

            if (ch == chEqual) { // '<='
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_LESS_EQUAL);
                starIsMultiplyOperator = false;
                ++currentOffset;
            } else {
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_LESS);
                starIsMultiplyOperator = false;
            }
            break;
        case CHARTYPE_GREATER: // '>' and '>='
            if (++currentOffset == endOffset) {
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_GREATER);
                starIsMultiplyOperator = false;
                break;
            }

            ch = data[currentOffset];

            if (ch == chEqual) { // '>='
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_GREATER_EQUAL);
                starIsMultiplyOperator = false;
                ++currentOffset;
            } else {
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_GREATER);
                starIsMultiplyOperator = false;
            }
            break;
        //
        // [29] Literal ::= '"' [^"]* '"' | "'" [^']* "'"
        //
        case CHARTYPE_QUOTE:            // '\"' or '\''
            {
                XMLCh qchar = ch;
                if (++currentOffset == endOffset) {
                    return false; // REVISIT
                }

                ch = data[currentOffset];

                XMLSize_t litOffset = currentOffset;
                while (ch != qchar) {
                    if (++currentOffset == endOffset) {
                        return false; // REVISIT
                    }

                    ch = data[currentOffset];
                }

                addToken(tokens, XercesXPath::EXPRTOKEN_LITERAL);
                starIsMultiplyOperator = true;

                dataBuffer.set(data + litOffset, currentOffset - litOffset);
                tokens->addElement(fStringPool->addOrFind(dataBuffer.getRawBuffer()));
                ++currentOffset;
                break;
            }
        //
        // [30] Number ::= Digits ('.' Digits?)? | '.' Digits
        // [31] Digits ::= [0-9]+
        //
        case CHARTYPE_DIGIT:
            addToken(tokens, XercesXPath::EXPRTOKEN_NUMBER);
            starIsMultiplyOperator = true;
            currentOffset = scanNumber(data, endOffset, currentOffset, tokens);
            break;
        //
        // [36] VariableReference ::= '$' QName
        //
        case CHARTYPE_DOLLAR:
            if (++currentOffset == endOffset) {
                return false; // REVISIT
            }
            nameOffset = currentOffset;
            currentOffset = scanNCName(data, endOffset, currentOffset);

            if (currentOffset == nameOffset) {
                return false; // REVISIT
            }

            if (currentOffset < endOffset) {
                ch = data[currentOffset];
            }
            else {
                ch = 0;
            }

            dataBuffer.set(data + nameOffset, currentOffset - nameOffset);
            nameHandle = fStringPool->addOrFind(dataBuffer.getRawBuffer());
            prefixHandle = -1;

            if (ch == chColon) {

                prefixHandle = nameHandle;
                if (++currentOffset == endOffset) {
                    return false; // REVISIT
                }
                nameOffset = currentOffset;
                currentOffset = scanNCName(data, endOffset, currentOffset);

                if (currentOffset == nameOffset) {
                    return false; // REVISIT
                }

                dataBuffer.set(data + nameOffset, currentOffset - nameOffset);
                nameHandle = fStringPool->addOrFind(dataBuffer.getRawBuffer());
            }
            addToken(tokens, XercesXPath::EXPRTOKEN_VARIABLE_REFERENCE);
            starIsMultiplyOperator = true;
            tokens->addElement(prefixHandle);
            tokens->addElement(nameHandle);
            break;
        //
        // [37] NameTest ::= '*' | NCName ':' '*' | QName
        // [34] MultiplyOperator ::= '*'
        //
        case CHARTYPE_STAR:             // '*'
            //
            // 3.7 Lexical Structure
            //
            //  If there is a preceding token and the preceding token is not one of @, ::, (, [, , or
            //  an Operator, then a * must be recognized as a MultiplyOperator.
            //
            // Otherwise, the token must not be recognized as a MultiplyOperator.
            //
            if (starIsMultiplyOperator) {
                addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_MULT);
                starIsMultiplyOperator = false;
            } else {
                addToken(tokens, XercesXPath::EXPRTOKEN_NAMETEST_ANY);
                starIsMultiplyOperator = true;
            }

            ++currentOffset;
            break;
        //
        // NCName, QName and non-terminals
        //
        case CHARTYPE_NONASCII: // possibly a valid non-ascii 'Letter' (BaseChar | Ideographic)
        case CHARTYPE_LETTER:
        case CHARTYPE_UNDERSCORE:
            {
            //
            // 3.7 Lexical Structure
            //
            //  If there is a preceding token and the preceding token is not one of @, ::, (, [, , or
            //  an Operator, then an NCName must be recognized as an OperatorName.
            //
            //  If the character following an NCName (possibly after intervening ExprWhitespace) is (,
            //  then the token must be recognized as a NodeType or a FunctionName.
            //
            //  If the two characters following an NCName (possibly after intervening ExprWhitespace)
            //  are ::, then the token must be recognized as an AxisName.
            //
            //  Otherwise, the token must not be recognized as an OperatorName, a NodeType, a
            //  FunctionName, or an AxisName.
            //
            // [33] OperatorName ::= 'and' | 'or' | 'mod' | 'div'
            // [38] NodeType ::= 'comment' | 'text' | 'processing-instruction' | 'node'
            // [35] FunctionName ::= QName - NodeType
            // [6] AxisName ::= (see above)
            //
            // [37] NameTest ::= '*' | NCName ':' '*' | QName
            // [5] NCName ::= (Letter | '_') (NCNameChar)*
            // [?] NCNameChar ::= Letter | Digit | '.' | '-' | '_'  (ascii subset of 'NCNameChar')
            // [?] QName ::= (NCName ':')? NCName
            // [?] Letter ::= [A-Za-z]                              (ascii subset of 'Letter')
            // [?] Digit ::= [0-9]                                  (ascii subset of 'Digit')
            //
            nameOffset = currentOffset;
            currentOffset = scanNCName(data, endOffset, currentOffset);
            if (currentOffset == nameOffset) {
                return false; // REVISIT
			}

            if (currentOffset < endOffset) {
                ch = data[currentOffset];
            }
            else {
                ch = 0;
            }

            dataBuffer.set(data + nameOffset, currentOffset - nameOffset);
            nameHandle = fStringPool->addOrFind(dataBuffer.getRawBuffer());

            bool isNameTestNCName = false;
            bool isAxisName = false;
            prefixHandle = -1;

            if (ch == chColon) {

                if (++currentOffset == endOffset) {
                    return false; // REVISIT
                }

                ch = data[currentOffset];

                if (ch == chAsterisk) {
                    if (++currentOffset < endOffset) {
                        ch = data[currentOffset];
                    }

                    isNameTestNCName = true;
                } else if (ch == chColon) {
                    if (++currentOffset < endOffset) {
                        ch = data[currentOffset];
                    }

                    isAxisName = true;
                } else {
                    prefixHandle = nameHandle;
                    nameOffset = currentOffset;
                    currentOffset = scanNCName(data, endOffset, currentOffset);
                    if (currentOffset == nameOffset) {
                        return false; // REVISIT
                    }
                    if (currentOffset < endOffset) {
                        ch = data[currentOffset];
                    }
                    else {
                        ch = 0;
                    }

                    dataBuffer.set(data + nameOffset, currentOffset - nameOffset);
                    nameHandle = fStringPool->addOrFind(dataBuffer.getRawBuffer());
                }
            }
            //
            // [39] ExprWhitespace ::= S
            //
            while (XMLChar1_0::isWhitespace(ch)) {
                if (++currentOffset == endOffset) {
                    break;
                }
                ch = data[currentOffset];
            }

            //
            //  If there is a preceding token and the preceding token is not one of @, ::, (, [, , or
            //  an Operator, then an NCName must be recognized as an OperatorName.
            //
            if (starIsMultiplyOperator) {
                if (nameHandle == fAndSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_AND);
                    starIsMultiplyOperator = false;
                } else if (nameHandle == fOrSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_OR);
                    starIsMultiplyOperator = false;
                } else if (nameHandle == fModSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_MOD);
                    starIsMultiplyOperator = false;
                } else if (nameHandle == fDivSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_OPERATOR_DIV);
                    starIsMultiplyOperator = false;
                } else {
                    return false; // REVISIT
                }

                if (isNameTestNCName) {
                    return false; // REVISIT - NCName:* where an OperatorName is required
                } else if (isAxisName) {
                    return false; // REVISIT - AxisName:: where an OperatorName is required
                }
                break;
            }
            //
            //  If the character following an NCName (possibly after intervening ExprWhitespace) is (,
            //  then the token must be recognized as a NodeType or a FunctionName.
            //
            if (ch == chOpenParen && !isNameTestNCName && !isAxisName) {
                if (nameHandle == fCommentSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_NODETYPE_COMMENT);
                } else if (nameHandle == fTextSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_NODETYPE_TEXT);
                } else if (nameHandle == fPISymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_NODETYPE_PI);
                } else if (nameHandle == fNodeSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_NODETYPE_NODE);
                } else {
                    addToken(tokens, XercesXPath::EXPRTOKEN_FUNCTION_NAME);
                    tokens->addElement(prefixHandle);
                    tokens->addElement(nameHandle);
                }
                addToken(tokens, XercesXPath::EXPRTOKEN_OPEN_PAREN);
                starIsMultiplyOperator = false;
                ++currentOffset;
                break;
            }

            //
            //  If the two characters following an NCName (possibly after intervening ExprWhitespace)
            //  are ::, then the token must be recognized as an AxisName.
            //
            if (isAxisName ||
                (ch == chColon && currentOffset + 1 < endOffset &&
                 data[currentOffset + 1] == chColon)) {

                if (nameHandle == fAncestorSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_ANCESTOR);
                } else if (nameHandle == fAncestorOrSelfSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_ANCESTOR_OR_SELF);
                } else if (nameHandle == fAttributeSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_ATTRIBUTE);
                } else if (nameHandle == fChildSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_CHILD);
                } else if (nameHandle == fDescendantSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_DESCENDANT);
                } else if (nameHandle == fDescendantOrSelfSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_DESCENDANT_OR_SELF);
                } else if (nameHandle == fFollowingSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_FOLLOWING);
                } else if (nameHandle == fFollowingSiblingSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_FOLLOWING_SIBLING);
                } else if (nameHandle == fNamespaceSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_NAMESPACE);
                } else if (nameHandle == fParentSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_PARENT);
                } else if (nameHandle == fPrecedingSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_PRECEDING);
                } else if (nameHandle == fPrecedingSiblingSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_PRECEDING_SIBLING);
                } else if (nameHandle == fSelfSymbol) {
                    addToken(tokens, XercesXPath::EXPRTOKEN_AXISNAME_SELF);
                } else {
                    return false; // REVISIT
                }

                if (isNameTestNCName) {
                    return false; // REVISIT - "NCName:* ::" where "AxisName ::" is required
                }

                addToken(tokens, XercesXPath::EXPRTOKEN_DOUBLE_COLON);
                starIsMultiplyOperator = false;
                if (!isAxisName) {
                    currentOffset += 2;
                }
                break;
            }
            //
            //  Otherwise, the token must not be recognized as an OperatorName, a NodeType, a
            //  FunctionName, or an AxisName.
            //
            if (isNameTestNCName) {
                addToken(tokens, XercesXPath::EXPRTOKEN_NAMETEST_NAMESPACE);
                tokens->addElement(nameHandle);
            } else {
                addToken(tokens, XercesXPath::EXPRTOKEN_NAMETEST_QNAME);
                tokens->addElement(prefixHandle);
                tokens->addElement(nameHandle);
            }

            starIsMultiplyOperator = true;
            break;
            }
        default:
            {
            XMLCh str[2]= {ch, 0 };
            ThrowXMLwithMemMgr1(XPathException, XMLExcepts::XPath_InvalidChar, str, tokens->getMemoryManager());
            break;
            }
        }
    }

    return true;
}